

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O1

void __thiscall glslang::TAnonMember::dump(TAnonMember *this,TInfoSink *TInfoSink,bool param_2)

{
  uint n;
  int iVar1;
  TInfoSinkBase *this_00;
  undefined4 extraout_var;
  long lVar2;
  
  TInfoSinkBase::append(&TInfoSink->debug,"anonymous member ");
  n = (*(this->super_TSymbol)._vptr_TSymbol[0x17])(this);
  this_00 = TInfoSinkBase::operator<<(&TInfoSink->debug,n);
  TInfoSinkBase::append(this_00," of ");
  iVar1 = (*(this->super_TSymbol)._vptr_TSymbol[0x16])(this);
  lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
                    ((long *)CONCAT44(extraout_var,iVar1));
  TInfoSinkBase::append(this_00,*(char **)(lVar2 + 8));
  TInfoSinkBase::append(this_00,"\n");
  return;
}

Assistant:

void TAnonMember::dump(TInfoSink& TInfoSink, bool) const
{
    TInfoSink.debug << "anonymous member " << getMemberNumber() << " of " << getAnonContainer().getName().c_str()
                    << "\n";
}